

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O1

data_ptr_t __thiscall
duckdb::ArenaAllocator::Reallocate
          (ArenaAllocator *this,data_ptr_t pointer,idx_t old_size,idx_t size)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  data_ptr_t pdVar5;
  long lVar6;
  unsigned_long uVar7;
  
  if (old_size != size) {
    _Var1._M_head_impl =
         (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>
         ._M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>
         .super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
    uVar7 = (_Var1._M_head_impl)->current_position;
    pdVar5 = *(data_ptr_t *)((long)&(_Var1._M_head_impl)->data + 8);
    lVar2 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar7);
    lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert(size);
    lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(old_size);
    if (pdVar5 + (uVar7 - old_size) != pointer) {
LAB_017e0c25:
      pdVar5 = Allocate(this,size);
      pdVar5 = (data_ptr_t)switchD_012e1ce8::default(pdVar5,pointer,old_size);
      return pdVar5;
    }
    if (old_size <= size) {
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        (((this->head).
                          super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>
                          .super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl)->
                         maximum_size);
      if (lVar6 < lVar2 + (lVar3 - lVar4)) goto LAB_017e0c25;
    }
    uVar7 = NumericCastImpl<unsigned_long,_long,_false>::Convert((lVar3 - lVar4) + lVar2);
    ((this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
     _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
     super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
     super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl)->current_position = uVar7;
  }
  return pointer;
}

Assistant:

data_ptr_t ArenaAllocator::Reallocate(data_ptr_t pointer, idx_t old_size, idx_t size) {
	D_ASSERT(head);
	if (old_size == size) {
		// nothing to do
		return pointer;
	}

	const auto head_ptr = head->data.get() + head->current_position - old_size;
	int64_t current_position = NumericCast<int64_t>(head->current_position);
	int64_t diff = NumericCast<int64_t>(size) - NumericCast<int64_t>(old_size);
	if (pointer == head_ptr &&
	    (size < old_size || current_position + diff <= NumericCast<int64_t>(head->maximum_size))) {
		// passed pointer is the head pointer, and the diff fits on the current chunk
		head->current_position = NumericCast<idx_t>(current_position + diff);
		return pointer;
	} else {
		// allocate new memory
		auto result = Allocate(size);
		memcpy(result, pointer, old_size);
		return result;
	}
}